

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TType::sameCoopMatShape(TType *this,TType *right)

{
  TVector<glslang::TArraySize> *pTVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint i;
  bool bVar6;
  bool bVar7;
  
  uVar4 = *(uint *)&this->field_0x8;
  if ((uVar4 & 0x600000) == 0) {
    return false;
  }
  if ((*(uint *)&right->field_0x8 & 0x600000) == 0) {
    bVar6 = false;
  }
  else {
    iVar5 = 0;
    bVar6 = false;
    if (((*(uint *)&right->field_0x8 ^ uVar4) >> 0x16 & 1) == 0) {
      i = uVar4 >> 0x15 & 1;
      pTVar1 = (this->typeParameters->arraySizes->sizes).sizes;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar5 = (int)((ulong)((long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pTVar1->
                                   super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ).
                                   super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      uVar4 = uVar4 >> 0x16 & 1;
      bVar6 = true;
      if ((int)i < (int)(iVar5 - uVar4)) {
        do {
          uVar2 = TSmallArrayVector::getDimSize(&this->typeParameters->arraySizes->sizes,i);
          uVar3 = TSmallArrayVector::getDimSize(&right->typeParameters->arraySizes->sizes,i);
          bVar6 = uVar2 == uVar3;
          if (!bVar6) {
            return bVar6;
          }
          bVar7 = (iVar5 - uVar4) - 1 != i;
          i = i + 1;
        } while (bVar7);
      }
    }
  }
  return bVar6;
}

Assistant:

bool isCoopMat() const { return coopmatNV || coopmatKHR; }